

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O3

void __thiscall ClosedFileInputSource::after(ClosedFileInputSource *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  qpdf_offset_t qVar2;
  undefined4 extraout_var;
  
  qVar2 = InputSource::getLastOffset
                    (&((this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_InputSource);
  (this->super_InputSource).last_offset = qVar2;
  iVar1 = (*(((this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_InputSource)._vptr_InputSource[4])();
  this->offset = CONCAT44(extraout_var,iVar1);
  if (this->stay_open == false) {
    this_00 = (this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void
ClosedFileInputSource::after()
{
    this->last_offset = this->fis->getLastOffset();
    this->offset = this->fis->tell();
    if (this->stay_open) {
        return;
    }
    this->fis = nullptr;
}